

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int css_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi,
            double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
            double *hess)

{
  size_t __size;
  int N_00;
  uint uVar1;
  double *oup;
  alik_css_seas_object __ptr;
  double *xi;
  double *xf;
  double *col;
  double *dx;
  int *ipiv;
  double *oup_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  int N_01;
  double dVar8;
  undefined1 local_c0 [8];
  custom_function css_min;
  
  pvVar5 = (void *)(ulong)(uint)q;
  uVar4 = (ulong)(uint)N;
  oup = (double *)malloc((long)(N - D * s) << 3);
  __ptr = alik_css_seas_init(p,d,q,s,P,D,Q,N);
  N_00 = __ptr->pq;
  lVar6 = (long)N_00;
  __size = lVar6 * 8;
  xi = (double *)malloc(__size);
  xf = (double *)malloc(__size);
  col = (double *)malloc(__size * lVar6);
  dx = (double *)malloc(__size);
  ipiv = (int *)malloc(lVar6 * 4);
  if (D < 1) {
    if (0 < N) {
      memcpy(oup,inp,uVar4 << 3);
    }
  }
  else {
    uVar1 = diffs(inp,N,D,s,oup);
    uVar4 = (ulong)uVar1;
  }
  iVar7 = (int)uVar4;
  oup_00 = (double *)malloc((long)(iVar7 - d) << 3);
  if (d < 1) {
    if (0 < iVar7) {
      memcpy(oup_00,oup,uVar4 << 3);
    }
  }
  else {
    uVar1 = diff(oup,iVar7,d,oup_00);
    uVar4 = (ulong)uVar1;
  }
  N_01 = (int)uVar4;
  __ptr->N = N_01;
  iVar7 = __ptr->offset;
  if (0 < p) {
    memset(xi,0,(ulong)(uint)p * 8);
  }
  css_min.params = pvVar5;
  if (0 < q) {
    memset(xi + p,0,(long)pvVar5 * 8);
  }
  if (0 < P) {
    uVar3 = 0;
    do {
      xi[(long)(q + p) + uVar3] = 0.0;
      uVar3 = uVar3 + 1;
    } while ((uint)P != uVar3);
  }
  if (0 < Q) {
    uVar3 = 0;
    do {
      xi[(long)(q + p + P) + uVar3] = 0.0;
      uVar3 = uVar3 + 1;
    } while ((uint)Q != uVar3);
  }
  dVar8 = 0.0;
  if (__ptr->M == 1) {
    dVar8 = mean(oup_00,N_01);
    xi[q + p + P + Q] = dVar8;
  }
  *wmean = dVar8;
  __ptr->mean = dVar8;
  if (0 < N_01) {
    uVar3 = 0;
    do {
      dVar8 = oup_00[uVar3];
      __ptr->x[(long)(iVar7 + N_01 * 2) + uVar3] = dVar8;
      __ptr->x[(long)iVar7 + uVar3] = dVar8;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (N_01 < N_01 * 2) {
    memset(__ptr->x + (iVar7 + N_01),0,(ulong)(N_01 - 1) * 8 + 8);
  }
  local_c0 = (undefined1  [8])fcss_seas;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar1 = fminunc((custom_function *)local_c0,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if ((0xf < uVar1) || ((0x8011U >> (uVar1 & 0x1f) & 1) == 0)) {
    uVar1 = 1;
  }
  if (0 < N_00) {
    lVar2 = 0;
    do {
      dx[lVar2] = 1.0;
      lVar2 = lVar2 + 1;
    } while (lVar6 != lVar2);
  }
  hessian_fd((custom_function *)local_c0,xf,N_00,dx,__ptr->eps,hess);
  mtranspose(hess,N_00,N_00,col);
  if (N_00 != 0) {
    uVar4 = 0;
    do {
      col[uVar4] = (hess[uVar4] + col[uVar4]) * (double)(N_01 - (D * s + d)) * 0.5;
      uVar4 = uVar4 + 1;
    } while (N_00 * N_00 + (uint)(N_00 * N_00 == 0) != uVar4);
  }
  ludecomp(col,N_00,ipiv);
  minverse(col,N_00,ipiv,hess);
  if (0 < p) {
    memcpy(phi,xf,(ulong)(uint)p << 3);
  }
  if (0 < q) {
    pvVar5 = (void *)0x0;
    do {
      theta[(long)pvVar5] = -xf[(long)p + (long)pvVar5];
      pvVar5 = (void *)((long)pvVar5 + 1);
    } while (css_min.params != pvVar5);
  }
  if (0 < P) {
    uVar4 = 0;
    do {
      PHI[uVar4] = xf[(long)(q + p) + uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)P != uVar4);
  }
  if (0 < Q) {
    uVar4 = 0;
    do {
      THETA[uVar4] = -xf[(long)(q + p + P) + uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)Q != uVar4);
  }
  dVar8 = 0.0;
  if (__ptr->M == 1) {
    dVar8 = xf[q + p + P + Q];
  }
  *wmean = dVar8;
  *var = __ptr->ssq / (double)N_01;
  *loglik = __ptr->loglik;
  free(xi);
  free(xf);
  free(oup);
  free(oup_00);
  free(col);
  free(dx);
  free(ipiv);
  free(__ptr);
  return uVar1;
}

Assistant:

int css_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA, double *wmean, double *var,double *loglik,double *hess) {
	int i, pq, retval, length, offset,ret;
	double *b, *tf, *x, *inp2,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_seas_object obj;
	//custom_function as154_min;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	maxstep = 1.0;

	obj = alik_css_seas_init(p, d, q, s, P, D, Q, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);
	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = 0.0;
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = mean(x, N);
		*wmean = b[p + q + P + Q];
	}
	else {
		*wmean = 0.0;
	}

	obj->mean = *wmean;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	custom_function css_min = { fcss_seas, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double)N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css_seas(obj);
	return ret;
}